

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PageAllocator.h
# Opt level: O2

USHORT __thiscall
Memory::
PageAllocatorBase<Memory::PreReservedVirtualAllocWrapper,_Memory::SegmentBase<Memory::PreReservedVirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_>
::ZeroPageQueue::QueryDepth(ZeroPageQueue *this)

{
  FreePageEntry *pFVar1;
  USHORT UVar2;
  AutoCriticalSection local_20;
  AutoCriticalSection autoCS;
  
  local_20.cs = &(this->super_BackgroundPageQueue).backgroundPageQueueCriticalSection;
  CCLock::Enter(&(local_20.cs)->super_CCLock);
  pFVar1 = (FreePageEntry *)&this->pendingZeroPageList;
  UVar2 = 0xffff;
  do {
    pFVar1 = pFVar1->Next;
    UVar2 = UVar2 + 1;
  } while (pFVar1 != (FreePageEntry *)0x0);
  AutoCriticalSection::~AutoCriticalSection(&local_20);
  return UVar2;
}

Assistant:

USHORT QueryDepth()
        {
#if SUPPORT_WIN32_SLIST
            return QueryDepthSList(&pendingZeroPageList);
#else
            AutoCriticalSection autoCS(&this->backgroundPageQueueCriticalSection);
            FreePageEntry* head = pendingZeroPageList;
            size_t count = 0;
            while (head)
            {
                head = head->Next;
                count++;
            }
            // If the specified singly linked list contains more than 65535 entries, QueryDepthSList returns the number of entries in the list modulo 65535
            return (USHORT)(count % 65536);
#endif
        }